

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_cfg.cpp
# Opt level: O3

bool __thiscall mocker::RewriteBranches::operator()(RewriteBranches *this)

{
  FunctionModule *pFVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _List_node_base *p_Var4;
  ulong uVar5;
  Jump *pJVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  BasicBlock *bb;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  shared_ptr<mocker::ir::Label> target;
  shared_ptr<mocker::ir::IntLiteral> condition;
  undefined1 local_69;
  Jump *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  shared_ptr<mocker::ir::Label> local_58;
  shared_ptr<mocker::ir::Addr> local_48;
  _List_node_base *local_38;
  
  pFVar1 = (this->super_FuncPass).func;
  p_Var8 = (pFVar1->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  local_38 = (_List_node_base *)&pFVar1->bbs;
  if (p_Var8 != local_38) {
    do {
      for (p_Var9 = p_Var8[1]._M_prev; p_Var9 != (_List_node_base *)&p_Var8[1]._M_prev;
          p_Var9 = p_Var9->_M_next) {
        p_Var2 = p_Var9[1]._M_next;
        if (*(int *)&p_Var2->_M_prev == 0xb) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9[1]._M_prev;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                    (&local_48,(IntLiteral *)((long)(p_Var2 + 1) + 8));
          if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            this->cnt = this->cnt + 1;
            uVar5 = (ulong)(local_48.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            [1]._vptr_Addr == (_func_int **)0x0);
            local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)((long)(p_Var2 + uVar5 + 2) + 8);
            local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[uVar5 + 3]._M_next;
            if (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_68 = (Jump *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::ir::Jump,std::allocator<mocker::ir::Jump>,std::shared_ptr<mocker::ir::Label>&>
                      (&_Stack_60,&local_68,(allocator<mocker::ir::Jump> *)&local_69,&local_58);
            _Var7._M_pi = _Stack_60._M_pi;
            pJVar6 = local_68;
            local_68 = (Jump *)0x0;
            _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9[1]._M_prev;
            p_Var9[1]._M_next = (_List_node_base *)pJVar6;
            p_Var9[1]._M_prev = (_List_node_base *)_Var7._M_pi;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
              }
            }
            uVar5 = (ulong)(local_48.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            [1]._vptr_Addr != (_func_int **)0x0);
            p_Var4 = *(_List_node_base **)((long)(p_Var2 + uVar5 + 2) + 8);
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[uVar5 + 3]._M_next;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
            }
            bb = ir::FunctionModule::getMutableBasicBlock
                           ((this->super_FuncPass).func,(size_t)p_Var4->_M_prev);
            deletePhiOptionInBB(bb,(size_t)p_Var8[1]._M_next);
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            if (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_58.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
      p_Var8 = p_Var8->_M_next;
    } while (p_Var8 != local_38);
  }
  return this->cnt != 0;
}

Assistant:

bool RewriteBranches::operator()() {
  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto br = ir::dyc<ir::Branch>(inst);
      if (!br)
        continue;
      auto condition = ir::dyc<ir::IntLiteral>(br->getCondition());
      if (!condition)
        continue;
      ++cnt;
      auto target = condition->getVal() ? br->getThen() : br->getElse();
      inst = std::make_shared<ir::Jump>(target);
      auto notTarget = condition->getVal() ? br->getElse() : br->getThen();
      deletePhiOptionInBB(func.getMutableBasicBlock(notTarget->getID()),
                          bb.getLabelID());
    }
  }

  return cnt != 0;
}